

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Vec_Int_t * Gia_ManDetectFullAdders(Gia_Man_t *p,int fVerbose,Vec_Int_t **pvCutsXor2)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vFadds;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *local_38;
  Vec_Int_t *local_30;
  
  Dtc_ManComputeCuts(p,pvCutsXor2,&local_30,&local_38,fVerbose);
  iVar1 = local_30->nSize;
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  qsort(local_30->pArray,(long)(iVar3 >> 2),0x10,Dtc_ManCompare);
  p_00 = (Gia_Man_t *)local_38->pArray;
  iVar1 = local_38->nSize;
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  qsort(p_00,(long)(iVar3 >> 2),0x10,Dtc_ManCompare);
  vFadds = Dtc_ManFindCommonCuts(p_00,local_30,local_38);
  uVar2 = vFadds->nSize / 5;
  qsort(vFadds->pArray,(long)(int)uVar2,0x14,Dtc_ManCompare2);
  if (fVerbose != 0) {
    iVar1 = local_30->nSize;
    iVar3 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    iVar1 = local_38->nSize;
    iVar4 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    printf("XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n",(ulong)(uint)(iVar3 >> 2),
           (ulong)(uint)(iVar4 >> 2),(ulong)uVar2);
    Dtc_ManPrintFadds(vFadds);
  }
  if (local_30->pArray != (int *)0x0) {
    free(local_30->pArray);
  }
  free(local_30);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  return vFadds;
}

Assistant:

Vec_Int_t * Gia_ManDetectFullAdders( Gia_Man_t * p, int fVerbose, Vec_Int_t ** pvCutsXor2 )
{
    Vec_Int_t * vCutsXor, * vCutsMaj, * vFadds;
    Dtc_ManComputeCuts( p, pvCutsXor2, &vCutsXor, &vCutsMaj, fVerbose );
    qsort( Vec_IntArray(vCutsXor), (size_t)(Vec_IntSize(vCutsXor)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    qsort( Vec_IntArray(vCutsMaj), (size_t)(Vec_IntSize(vCutsMaj)/4), 16, (int (*)(const void *, const void *))Dtc_ManCompare );
    vFadds = Dtc_ManFindCommonCuts( p, vCutsXor, vCutsMaj );
    qsort( Vec_IntArray(vFadds), (size_t)(Vec_IntSize(vFadds)/5), 20, (int (*)(const void *, const void *))Dtc_ManCompare2 );
    if ( fVerbose )
        printf( "XOR3 cuts = %d.  MAJ cuts = %d.  Full-adders = %d.\n", Vec_IntSize(vCutsXor)/4, Vec_IntSize(vCutsMaj)/4, Vec_IntSize(vFadds)/5 );
    if ( fVerbose )
        Dtc_ManPrintFadds( vFadds );
    Vec_IntFree( vCutsXor );
    Vec_IntFree( vCutsMaj );
    return vFadds;
}